

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ConfidentialValue *
cfd::core::ConfidentialValue::GetCommitment
          (ConfidentialValue *__return_storage_ptr__,Amount *amount,
          ConfidentialAssetId *asset_commitment,BlindFactor *amount_blind_factor)

{
  uchar *bytes_out;
  uint64_t value;
  CfdException *pCVar1;
  value_type_conflict *__val;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> generator;
  undefined1 local_a0 [36];
  int local_7c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (asset_commitment->version_ < 2) {
    local_a0._0_8_ = "cfdcore_elements_transaction.cpp";
    local_a0._8_4_ = 0x28d;
    local_a0._16_8_ = "GetCommitment";
    logger::log<>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,"asset is not commitment.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a0._0_8_ = local_a0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"asset is not commitment.","");
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_a0);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bytes_out = (uchar *)operator_new(0x21);
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = bytes_out + 0x21;
  bytes_out[0x10] = '\0';
  bytes_out[0x11] = '\0';
  bytes_out[0x12] = '\0';
  bytes_out[0x13] = '\0';
  bytes_out[0x14] = '\0';
  bytes_out[0x15] = '\0';
  bytes_out[0x16] = '\0';
  bytes_out[0x17] = '\0';
  bytes_out[0x18] = '\0';
  bytes_out[0x19] = '\0';
  bytes_out[0x1a] = '\0';
  bytes_out[0x1b] = '\0';
  bytes_out[0x1c] = '\0';
  bytes_out[0x1d] = '\0';
  bytes_out[0x1e] = '\0';
  bytes_out[0x1f] = '\0';
  bytes_out[0] = '\0';
  bytes_out[1] = '\0';
  bytes_out[2] = '\0';
  bytes_out[3] = '\0';
  bytes_out[4] = '\0';
  bytes_out[5] = '\0';
  bytes_out[6] = '\0';
  bytes_out[7] = '\0';
  bytes_out[8] = '\0';
  bytes_out[9] = '\0';
  bytes_out[10] = '\0';
  bytes_out[0xb] = '\0';
  bytes_out[0xc] = '\0';
  bytes_out[0xd] = '\0';
  bytes_out[0xe] = '\0';
  bytes_out[0xf] = '\0';
  bytes_out[0x20] = '\0';
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = bytes_out;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ConfidentialAssetId::GetData((ByteData *)local_a0,asset_commitment);
  ByteData::GetBytes(&local_48,(ByteData *)local_a0);
  if ((pointer)local_a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._0_8_);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
             &(amount_blind_factor->data_).data_);
  ByteData256::GetBytes(&local_60,(ByteData256 *)local_a0);
  if ((pointer)local_a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a0._0_8_);
  }
  value = Amount::GetSatoshiValue(amount);
  local_7c = wally_asset_value_commitment
                       (value,local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,bytes_out,0x21);
  if (local_7c == 0) {
    ByteData::ByteData((ByteData *)local_a0,&local_78);
    ConfidentialValue(__return_storage_ptr__,(ByteData *)local_a0);
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_);
    }
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_a0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_a0._8_4_ = 0x298;
  local_a0._16_8_ = "GetCommitment";
  logger::log<int&>((CfdSourceLocation *)local_a0,kCfdLogLevelWarning,
                    "wally_asset_value_commitment NG[{}].",&local_7c);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0._0_8_ = local_a0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"calc amount commitment error.","");
  CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_a0);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool ConfidentialAssetId::HasBlinding() const {
  return (version_ != 0) && (version_ != kConfidentialVersion_1);
}